

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::GetCapitalizedType_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  Type TVar1;
  LogMessage *other;
  LogFinisher local_79;
  LogMessage local_78;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  objectivec *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  switch(TVar1) {
  case TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Double",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Float",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case TYPE_INT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Int64",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case TYPE_UINT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UInt64",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case TYPE_INT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Int32",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case TYPE_FIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Fixed64",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case TYPE_FIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Fixed32",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Bool",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  case TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"String",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case TYPE_GROUP:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Group",&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    break;
  case TYPE_MESSAGE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Message",&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
    break;
  case TYPE_BYTES:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Bytes",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    break;
  case TYPE_UINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UInt32",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case TYPE_ENUM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Enum",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    break;
  case TYPE_SFIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SFixed32",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case TYPE_SFIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SFixed64",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case TYPE_SINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SInt32",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case MAX_TYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SInt64",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
               ,0x32c);
    other = internal::LogMessage::operator<<(&local_78,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_79,other);
    internal::LogMessage::~LogMessage(&local_78);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetCapitalizedType(const FieldDescriptor* field) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32:
      return "Int32";
    case FieldDescriptor::TYPE_UINT32:
      return "UInt32";
    case FieldDescriptor::TYPE_SINT32:
      return "SInt32";
    case FieldDescriptor::TYPE_FIXED32:
      return "Fixed32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFixed32";
    case FieldDescriptor::TYPE_INT64:
      return "Int64";
    case FieldDescriptor::TYPE_UINT64:
      return "UInt64";
    case FieldDescriptor::TYPE_SINT64:
      return "SInt64";
    case FieldDescriptor::TYPE_FIXED64:
      return "Fixed64";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFixed64";
    case FieldDescriptor::TYPE_FLOAT:
      return "Float";
    case FieldDescriptor::TYPE_DOUBLE:
      return "Double";
    case FieldDescriptor::TYPE_BOOL:
      return "Bool";
    case FieldDescriptor::TYPE_STRING:
      return "String";
    case FieldDescriptor::TYPE_BYTES:
      return "Bytes";
    case FieldDescriptor::TYPE_ENUM:
      return "Enum";
    case FieldDescriptor::TYPE_GROUP:
      return "Group";
    case FieldDescriptor::TYPE_MESSAGE:
      return "Message";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return std::string();
}